

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScatteringRadiusCovariances.test.cpp
# Opt level: O1

void verifyChunk(ScatteringRadiusCovariances *chunk)

{
  int iVar1;
  long lVar2;
  variant_alternative_t<1UL,_variant<CovariancePairs,_SquareMatrix,_RectangularMatrix>_> *pvVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  AssertionHandler catchAssertionHandler_3;
  SquareMatrix stuff;
  undefined1 local_120 [8];
  undefined8 local_118;
  char *local_110;
  size_t local_108;
  char *local_100;
  bool local_e5;
  IResultCapture *local_e0;
  double local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  ITransientExpression local_98;
  double *local_88;
  WithinRelMatcher *local_80;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  IResultCapture *local_38;
  
  local_120 = (undefined1  [8])0x194494;
  local_118 = 0x67;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "3 == chunk.NI()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_78,macroName,(SourceLineInfo *)local_120,capturedExpression,
             ContinueOnFailure);
  iVar1 = (int)((ulong)((long)(chunk->ni_).
                              super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->ni_).
                             super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  local_118._0_2_ = CONCAT11(iVar1 == 3,true);
  local_120 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11b0;
  local_118 = CONCAT44(3,(undefined4)local_118);
  local_110 = "==";
  local_108 = 2;
  local_100 = (char *)CONCAT44(local_100._4_4_,iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_78,(ITransientExpression *)local_120);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_120);
  Catch::AssertionHandler::complete((AssertionHandler *)local_78);
  if (local_48[0xb] == false) {
    (*local_38->_vptr_IResultCapture[0x13])();
  }
  local_120 = (undefined1  [8])0x194494;
  local_118 = 0x68;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1d;
  capturedExpression_00.m_start = "3 == chunk.numberDataBlocks()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_78,macroName_00,(SourceLineInfo *)local_120,
             capturedExpression_00,ContinueOnFailure);
  iVar1 = (int)((ulong)((long)(chunk->ni_).
                              super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->ni_).
                             super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  local_118._0_2_ = CONCAT11(iVar1 == 3,true);
  local_120 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11b0;
  local_118 = CONCAT44(3,(undefined4)local_118);
  local_110 = "==";
  local_108 = 2;
  local_100 = (char *)CONCAT44(local_100._4_4_,iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_78,(ITransientExpression *)local_120);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_120);
  Catch::AssertionHandler::complete((AssertionHandler *)local_78);
  if (local_48[0xb] == false) {
    (*local_38->_vptr_IResultCapture[0x13])();
  }
  local_120 = (undefined1  [8])0x194494;
  local_118 = 0x69;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x18;
  capturedExpression_01.m_start = "3 == chunk.data().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_78,macroName_01,(SourceLineInfo *)local_120,
             capturedExpression_01,ContinueOnFailure);
  lVar2 = (long)(chunk->ni_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->ni_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_100 = (char *)((lVar2 >> 4) * -0x3333333333333333);
  local_118._0_2_ = CONCAT11(lVar2 == 0xf0,true);
  local_120 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11f0;
  local_118 = CONCAT44(3,(undefined4)local_118);
  local_110 = "==";
  local_108 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_78,(ITransientExpression *)local_120);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_120);
  Catch::AssertionHandler::complete((AssertionHandler *)local_78);
  if (local_48[0xb] == false) {
    (*local_38->_vptr_IResultCapture[0x13])();
  }
  pvVar3 = std::
           get<1ul,njoy::ENDFtk::section::CovariancePairs,njoy::ENDFtk::section::SquareMatrix,njoy::ENDFtk::section::RectangularMatrix>
                     ((chunk->ni_).
                      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  local_78._0_8_ =
       *(undefined8 *)
        &(pvVar3->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  local_78._8_8_ =
       (pvVar3->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_78._16_8_ =
       (pvVar3->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_78._24_8_ =
       (pvVar3->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_78._32_8_ =
       (pvVar3->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_78._40_8_ =
       (pvVar3->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,&(pvVar3->super_ListRecord).data);
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x6e;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0xf;
  capturedExpression_02.m_start = "0 == stuff.LS()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_02,(SourceLineInfo *)local_d0,
             capturedExpression_02,ContinueOnFailure);
  local_c8._1_1_ = local_78._24_4_ == 0;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11b0;
  local_c8 = local_c8 & 0xffffffff;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = local_78._24_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x6f;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x19;
  capturedExpression_03.m_start = "0 == stuff.symmetryFlag()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_03,(SourceLineInfo *)local_d0,
             capturedExpression_03,ContinueOnFailure);
  local_c8._1_1_ = local_78._24_4_ == 0;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11b0;
  local_c8 = local_c8 & 0xffffffff;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = local_78._24_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x70;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x14;
  capturedExpression_04.m_start = "!stuff.isSymmetric()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_04,(SourceLineInfo *)local_d0,
             capturedExpression_04,ContinueOnFailure);
  local_d0[0] = local_78._24_4_ == 0;
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_120,(ExprLhs<bool> *)local_d0)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x71;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0xf;
  capturedExpression_05.m_start = "5 == stuff.LB()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_05,(SourceLineInfo *)local_d0,
             capturedExpression_05,ContinueOnFailure);
  local_c8._1_1_ = local_78._16_4_ == 5;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11b0;
  local_c8._4_4_ = 5;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = local_78._16_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x72;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x16;
  capturedExpression_06.m_start = "5 == stuff.procedure()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_06,(SourceLineInfo *)local_d0,
             capturedExpression_06,ContinueOnFailure);
  local_c8._1_1_ = local_78._16_4_ == 5;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d11b0;
  local_c8._4_4_ = 5;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = local_78._16_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x73;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "7 == stuff.NT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_07,(SourceLineInfo *)local_d0,
             capturedExpression_07,ContinueOnFailure);
  lVar2 = CONCAT44(local_48._12_4_,local_48._8_4_) - local_48._0_8_;
  local_b8[0]._8_8_ = lVar2 >> 3;
  local_c8._1_1_ = lVar2 == 0x38;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d1270;
  local_c8._4_4_ = 7;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x74;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x19;
  capturedExpression_08.m_start = "7 == stuff.numberValues()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_08,(SourceLineInfo *)local_d0,
             capturedExpression_08,ContinueOnFailure);
  lVar2 = CONCAT44(local_48._12_4_,local_48._8_4_) - local_48._0_8_;
  local_b8[0]._8_8_ = lVar2 >> 3;
  local_c8._1_1_ = lVar2 == 0x38;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d1270;
  local_c8._4_4_ = 7;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x75;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0xf;
  capturedExpression_09.m_start = "3 == stuff.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_09,(SourceLineInfo *)local_d0,
             capturedExpression_09,ContinueOnFailure);
  local_c8._1_1_ = (char *)local_78._0_8_ == (char *)0x3;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d1270;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_8_ = local_78._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x76;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1b;
  capturedExpression_10.m_start = "3 == stuff.numberEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_10,(SourceLineInfo *)local_d0,
             capturedExpression_10,ContinueOnFailure);
  local_c8._1_1_ = (char *)local_78._0_8_ == (char *)0x3;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d1270;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_8_ = local_78._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x79;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x24;
  capturedExpression_11.m_start = "0., WithinRel( stuff.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_11,(SourceLineInfo *)local_d0,
             capturedExpression_11,ContinueOnFailure);
  local_d8 = 0.0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_d0,*(double *)local_48._0_8_);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x7a;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x26;
  capturedExpression_12.m_start = "100., WithinRel( stuff.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_12,(SourceLineInfo *)local_d0,
             capturedExpression_12,ContinueOnFailure);
  local_d8 = 100.0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_d0,*(double *)(local_48._0_8_ + 8));
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x7b;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x26;
  capturedExpression_13.m_start = "200., WithinRel( stuff.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_13,(SourceLineInfo *)local_d0,
             capturedExpression_13,ContinueOnFailure);
  local_d8 = 200.0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_d0,*(double *)(local_48._0_8_ + 0x10));
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x7c;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x22;
  capturedExpression_14.m_start = "1., WithinRel( stuff.values()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_14,(SourceLineInfo *)local_d0,
             capturedExpression_14,ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,*(double *)(local_48._0_8_ + local_78._0_8_ * 8));
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x7d;
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  capturedExpression_15.m_size = 0x22;
  capturedExpression_15.m_start = "2., WithinRel( stuff.values()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_15,(SourceLineInfo *)local_d0,
             capturedExpression_15,ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(double *)(local_48._0_8_ + (char *)(local_78._0_8_ + 1) * 8));
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x7e;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "3., WithinRel( stuff.values()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_16,(SourceLineInfo *)local_d0,
             capturedExpression_16,ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(double *)(local_48._0_8_ + (char *)(local_78._0_8_ + 2) * 8));
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x7f;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x22;
  capturedExpression_17.m_start = "4., WithinRel( stuff.values()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_17,(SourceLineInfo *)local_d0,
             capturedExpression_17,ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(double *)(local_48._0_8_ + (char *)(local_78._0_8_ + 3) * 8));
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d12b0;
  local_88 = &local_d8;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_120,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  local_d0 = (undefined1  [8])0x194494;
  local_c8 = (pointer)0x81;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x10;
  capturedExpression_18.m_start = "10 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_120,macroName_18,(SourceLineInfo *)local_d0,
             capturedExpression_18,ContinueOnFailure);
  local_b8[0]._8_8_ = njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances::NC(chunk);
  local_c8._1_1_ = local_b8[0]._8_8_ == 10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d1270;
  local_c8._4_4_ = 10;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_120,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_120);
  if (local_e5 == false) {
    (*local_e0->_vptr_IResultCapture[0x13])();
  }
  if ((double *)local_48._0_8_ != (double *)0x0) {
    operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
  }
  return;
}

Assistant:

void verifyChunk( const ScatteringRadiusCovariances& chunk ) {

  CHECK( 3 == chunk.NI() );
  CHECK( 3 == chunk.numberDataBlocks() );
  CHECK( 3 == chunk.data().size() );

  auto stuff = std::get< SquareMatrix >( chunk.data()[0] );

  // metadata
  CHECK( 0 == stuff.LS() );
  CHECK( 0 == stuff.symmetryFlag() );
  CHECK( !stuff.isSymmetric() );
  CHECK( 5 == stuff.LB() );
  CHECK( 5 == stuff.procedure() );
  CHECK( 7 == stuff.NT() );
  CHECK( 7 == stuff.numberValues() );
  CHECK( 3 == stuff.NE() );
  CHECK( 3 == stuff.numberEnergies() );

  // values
  CHECK_THAT( 0., WithinRel( stuff.energies()[0] ) );
  CHECK_THAT( 100., WithinRel( stuff.energies()[1] ) );
  CHECK_THAT( 200., WithinRel( stuff.energies()[2] ) );
  CHECK_THAT( 1., WithinRel( stuff.values()[0] ) );
  CHECK_THAT( 2., WithinRel( stuff.values()[1] ) );
  CHECK_THAT( 3., WithinRel( stuff.values()[2] ) );
  CHECK_THAT( 4., WithinRel( stuff.values()[3] ) );

  CHECK( 10 == chunk.NC() );
}